

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

uint32_t map_add_int32_val_int32_col
                   (uint32_t n,int32_t *res,int32_t val,int32_t *col2,uint32_t *sel)

{
  ulong uVar1;
  
  if (sel == (uint32_t *)0x0) {
    if (n != 0) {
      uVar1 = 0;
      do {
        res[uVar1] = col2[uVar1] + val;
        uVar1 = uVar1 + 1;
      } while (n != uVar1);
    }
  }
  else if (n != 0) {
    uVar1 = 0;
    do {
      res[uVar1] = col2[sel[uVar1]] + val;
      uVar1 = uVar1 + 1;
    } while (n != uVar1);
  }
  return n;
}

Assistant:

uint32_t map_add_int32_val_int32_col(uint32_t n, int32_t *res, int32_t val, int32_t *col2, uint32_t *sel) {
    if (sel == nullptr) {
        for (uint32_t i = 0; i < n; i++)
            res[i] = val + col2[i];
    }
    else {
        for (uint32_t i = 0; i < n; i++)
            res[i] = val + col2[sel[i]];
    }

    return n;
}